

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

void __thiscall wasm::BranchUtils::BranchTargets::Inner::~Inner(Inner *this)

{
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::~_Rb_tree(&(this->branches)._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Expression_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
  ::~_Rb_tree(&(this->targets)._M_t);
  std::
  _Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
  ::~_Vector_base(&(this->
                   super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
                   ).
                   super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
                   .stack.flexible.
                   super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
                 );
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name name) {
        if (name.is()) {
          targets[name] = curr;
        }
      });
      operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          branches[name].insert(curr);
        }
      });
    }